

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall mario::EPoller::updateChannel(EPoller *this,Channel *channel)

{
  Channel *pCVar1;
  bool bVar2;
  Writer *pWVar3;
  char *pcVar4;
  mapped_type *ppCVar5;
  int __c;
  int *log;
  int local_ac;
  int fd_1;
  int fd;
  int index;
  Writer local_90;
  Channel *local_18;
  Channel *channel_local;
  EPoller *this_local;
  
  local_18 = channel;
  channel_local = (Channel *)this;
  assertInLoopThread(this);
  el::base::Writer::Writer
            (&local_90,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
             ,0x3d,"void mario::EPoller::updateChannel(Channel *)",NormalLog,0);
  pWVar3 = el::base::Writer::construct(&local_90,1,el::base::consts::kDefaultLoggerId);
  pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [5])"fd= ");
  index = Channel::fd(local_18);
  pWVar3 = el::base::Writer::operator<<(pWVar3,&index);
  pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [12])", events = ");
  fd = Channel::events(local_18);
  log = &fd;
  el::base::Writer::operator<<(pWVar3,log);
  el::base::Writer::~Writer(&local_90);
  pcVar4 = Channel::index(local_18,(char *)log,__c);
  fd_1 = (int)pcVar4;
  if ((fd_1 == -1) || (fd_1 == 2)) {
    local_ac = Channel::fd(local_18);
    pCVar1 = local_18;
    if (fd_1 == -1) {
      ppCVar5 = std::
                map<int,_mario::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_mario::Channel_*>_>_>
                ::operator[](&this->_channels,&local_ac);
      *ppCVar5 = pCVar1;
    }
    Channel::setIndex(local_18,1);
    update(this,1,local_18);
  }
  else {
    Channel::fd(local_18);
    bVar2 = Channel::isNoneEvent(local_18);
    if (bVar2) {
      update(this,2,local_18);
      Channel::setIndex(local_18,2);
    }
    else {
      update(this,3,local_18);
    }
  }
  return;
}

Assistant:

void EPoller::updateChannel(Channel* channel) {
    assertInLoopThread();
    LOG(INFO) << "fd= "<< channel->fd() << ", events = " << channel->events();
    const int index = channel->index();
    if (index == kNew || index == kDeleted) {
        int fd = channel->fd();
        if (index == kNew) {
            _channels[fd] = channel;
        }
        channel->setIndex(kAdded);
        update(EPOLL_CTL_ADD, channel);
    } else {
        int fd = channel->fd();
        if (channel->isNoneEvent()) {
            update(EPOLL_CTL_DEL, channel);
            channel->setIndex(kDeleted);
        } else {
            update(EPOLL_CTL_MOD, channel);
        }
    }
}